

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  SPIRExpression *pSVar1;
  SPIRExpression *pSVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  iterator iVar4;
  SPIRVariable *pSVar5;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this_00;
  uint32_t local_2c;
  uint32_t local_28;
  TypedID<(diligent_spirv_cross::Types)0> local_24;
  
  local_2c = source_expression;
  local_28 = dst;
  pSVar1 = maybe_get<diligent_spirv_cross::SPIRExpression>(this,dst);
  if ((pSVar1 != (SPIRExpression *)0x0) && (this->position_invariant != false)) {
    pSVar2 = maybe_get<diligent_spirv_cross::SPIRExpression>(this,source_expression);
    if (pSVar2 != (SPIRExpression *)0x0) {
      pTVar3 = (pSVar1->invariance_dependencies).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
      pTVar3 = ::std::
               __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (pTVar3,pTVar3 + (pSVar1->invariance_dependencies).
                                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                          .buffer_size,&local_2c);
      if (pTVar3 == (pSVar1->invariance_dependencies).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                    .ptr + (pSVar1->invariance_dependencies).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           .buffer_size) {
        local_24.id = local_2c;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                  (&pSVar1->invariance_dependencies,&local_24);
      }
    }
  }
  iVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->forwarded_temporaries)._M_h,&local_28);
  if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    iVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->forced_temporaries)._M_h,&local_28);
    if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pSVar5 = maybe_get<diligent_spirv_cross::SPIRVariable>(this,local_2c);
      if ((pSVar5 != (SPIRVariable *)0x0) && (pSVar5->phi_variable == true)) {
        local_24.id = local_28;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                  (&pSVar5->dependees,&local_24);
      }
      pSVar2 = maybe_get<diligent_spirv_cross::SPIRExpression>(this,local_2c);
      if (pSVar2 != (SPIRExpression *)0x0) {
        this_00 = &pSVar1->expression_dependencies;
        local_24.id = local_2c;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                  (this_00,&local_24);
        pTVar3 = (pSVar2->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
                  (this_00,(pSVar1->expression_dependencies).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           .ptr + (pSVar1->expression_dependencies).
                                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                  .buffer_size,pTVar3,
                   pTVar3 + (pSVar2->expression_dependencies).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                            .buffer_size);
        pTVar3 = (pSVar1->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr;
        ::std::
        __sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar3,pTVar3 + (pSVar1->expression_dependencies).
                                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                   .buffer_size);
        pTVar3 = (pSVar1->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr;
        pTVar3 = ::std::
                 __unique<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pTVar3,pTVar3 + (pSVar1->expression_dependencies).
                                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                            .buffer_size);
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::erase
                  (this_00,pTVar3,
                   (pSVar1->expression_dependencies).
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                   ptr + (pSVar1->expression_dependencies).
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         .buffer_size);
      }
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	auto *ptr_e = maybe_get<SPIRExpression>(dst);

	if (is_position_invariant() && ptr_e && maybe_get<SPIRExpression>(source_expression))
	{
		auto &deps = ptr_e->invariance_dependencies;
		if (std::find(deps.begin(), deps.end(), source_expression) == deps.end())
			deps.push_back(source_expression);
	}

	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = *ptr_e;
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}